

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall
SQVM::StartCall(SQVM *this,SQClosure *closure,SQInteger target,SQInteger args,SQInteger stackbase,
               bool tailcall)

{
  SQFunctionProto *pSVar1;
  long lVar2;
  SQObjectPtr *pSVar3;
  long lVar4;
  bool bVar5;
  long lVar6;
  SQArray *x;
  SQObjectPtr *this_00;
  undefined1 local_b8 [8];
  SQObjectPtr temp;
  SQGenerator *gen;
  SQFunctionProto *f;
  SQInteger n_1;
  SQInteger diff;
  SQInteger ndef;
  SQInteger n;
  SQInteger pbase;
  SQArray *arr;
  SQInteger nvargs;
  SQInteger nargs;
  SQInteger newtop;
  SQInteger paramssize;
  SQFunctionProto *func;
  bool tailcall_local;
  SQInteger stackbase_local;
  SQInteger args_local;
  SQInteger target_local;
  SQClosure *closure_local;
  SQVM *this_local;
  
  pSVar1 = closure->_function;
  lVar6 = pSVar1->_nparameters;
  lVar2 = pSVar1->_stacksize;
  if (pSVar1->_varparams == 0) {
    if (lVar6 != args) {
      lVar4 = pSVar1->_ndefaultparams;
      if (((lVar4 == 0) || (lVar6 <= args)) || (lVar4 < lVar6 - args)) {
        Raise_Error(this,"wrong number of parameters");
        return false;
      }
      nvargs = args;
      for (f = (SQFunctionProto *)(lVar4 - (lVar6 - args)); (long)f < lVar4;
          f = (SQFunctionProto *)
              ((long)&(f->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted + 1)) {
        ::SQObjectPtr::operator=
                  ((this->_stack)._vals + stackbase + nvargs,closure->_defaultparams + (long)f);
        nvargs = nvargs + 1;
      }
    }
  }
  else {
    lVar6 = lVar6 + -1;
    if (args < lVar6) {
      Raise_Error(this,"wrong number of parameters");
      return false;
    }
    x = SQArray::Create(this->_sharedstate,args - lVar6);
    n = stackbase + lVar6;
    for (ndef = 0; ndef < args - lVar6; ndef = ndef + 1) {
      pSVar3 = (this->_stack)._vals;
      this_00 = sqvector<SQObjectPtr>::operator[](&x->_values,ndef);
      ::SQObjectPtr::operator=(this_00,pSVar3 + n);
      ::SQObjectPtr::Null((this->_stack)._vals + n);
      n = n + 1;
    }
    ::SQObjectPtr::operator=((this->_stack)._vals + stackbase + lVar6,x);
  }
  if (closure->_env != (SQWeakRef *)0x0) {
    ::SQObjectPtr::operator=((this->_stack)._vals + stackbase,&closure->_env->_obj);
  }
  bVar5 = EnterFrame(this,stackbase,stackbase + lVar2,tailcall);
  if (bVar5) {
    ::SQObjectPtr::operator=(&this->ci->_closure,closure);
    this->ci->_literals = pSVar1->_literals;
    this->ci->_ip = pSVar1->_instructions;
    this->ci->_target = (SQInt32)target;
    if ((this->_debughook & 1U) != 0) {
      CallDebugHook(this,99,0);
    }
    if ((closure->_function->_bgenerator & 1U) != 0) {
      pSVar1 = closure->_function;
      temp.super_SQObject._unVal.pGenerator = SQGenerator::Create(this->_sharedstate,closure);
      bVar5 = SQGenerator::Yield(temp.super_SQObject._unVal.pGenerator,this,pSVar1->_stacksize);
      if (!bVar5) {
        return false;
      }
      ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_b8);
      Return(this,1,target,(SQObjectPtr *)local_b8);
      ::SQObjectPtr::operator=
                ((this->_stack)._vals + this->_stackbase + target,
                 temp.super_SQObject._unVal.pGenerator);
      ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_b8);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SQVM::StartCall(SQClosure *closure,SQInteger target,SQInteger args,SQInteger stackbase,bool tailcall)
{
    SQFunctionProto *func = closure->_function;

    SQInteger paramssize = func->_nparameters;
    const SQInteger newtop = stackbase + func->_stacksize;
    SQInteger nargs = args;
    if(func->_varparams)
    {
        paramssize--;
        if (nargs < paramssize) {
            Raise_Error(_SC("wrong number of parameters"));
            return false;
        }

        //dumpstack(stackbase);
        SQInteger nvargs = nargs - paramssize;
        SQArray *arr = SQArray::Create(_ss(this),nvargs);
        SQInteger pbase = stackbase+paramssize;
        for(SQInteger n = 0; n < nvargs; n++) {
            arr->_values[n] = _stack._vals[pbase];
            _stack._vals[pbase].Null();
            pbase++;

        }
        _stack._vals[stackbase+paramssize] = arr;
        //dumpstack(stackbase);
    }
    else if (paramssize != nargs) {
        SQInteger ndef = func->_ndefaultparams;
        SQInteger diff;
        if(ndef && nargs < paramssize && (diff = paramssize - nargs) <= ndef) {
            for(SQInteger n = ndef - diff; n < ndef; n++) {
                _stack._vals[stackbase + (nargs++)] = closure->_defaultparams[n];
            }
        }
        else {
            Raise_Error(_SC("wrong number of parameters"));
            return false;
        }
    }

    if(closure->_env) {
        _stack._vals[stackbase] = closure->_env->_obj;
    }

    if(!EnterFrame(stackbase, newtop, tailcall)) return false;

    ci->_closure  = closure;
    ci->_literals = func->_literals;
    ci->_ip       = func->_instructions;
    ci->_target   = (SQInt32)target;

    if (_debughook) {
        CallDebugHook(_SC('c'));
    }

    if (closure->_function->_bgenerator) {
        SQFunctionProto *f = closure->_function;
        SQGenerator *gen = SQGenerator::Create(_ss(this), closure);
        if(!gen->Yield(this,f->_stacksize))
            return false;
        SQObjectPtr temp;
        Return(1, target, temp);
        STK(target) = gen;
    }


    return true;
}